

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2DocsSamples.cpp
# Opt level: O2

void C_A_T_C_H_T_E_S_T_3(void)

{
  bool bVar1;
  uchar *in_RCX;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t in_R8;
  allocator<char> local_14d;
  Greeting object_under_test;
  string local_148;
  SourceLineInfo local_128;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  undefined1 auStack_f0 [24];
  _Invoker_type local_d8;
  Reporter *pRStack_d0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  undefined8 local_b8;
  Section local_a8;
  
  object_under_test.nationality = British;
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Catch2_Tests/docs/Catch2DocsSamples.cpp"
  ;
  local_128.line = 0x52;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"British",&local_14d);
  Catch::SectionInfo::SectionInfo((SectionInfo *)local_118,&local_128,&local_148);
  Catch::Section::Section(&local_a8,(SectionInfo *)local_118);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)local_118);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_a8);
  if (bVar1) {
    Greeting::getGreetingFor_abi_cxx11_((string *)&local_148,&object_under_test,British);
    local_c8 = (element_type *)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8 = (_Invoker_type)0x0;
    pRStack_d0 = (Reporter *)0x0;
    auStack_f0._8_8_ = 0;
    auStack_f0._16_8_ = 0;
    aStack_100._8_8_ = (pointer)0x0;
    auStack_f0._0_8_ = (void *)0x0;
    local_118._16_8_ = 0;
    aStack_100._0_8_ = 0;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_b8._0_1_ = false;
    local_b8._1_7_ = 0;
    ApprovalTests::Options::Options((Options *)local_118);
    ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              ((EVP_PKEY_CTX *)&local_148,local_118,siglen,in_RCX,in_R8);
    ApprovalTests::Options::~Options((Options *)local_118);
    std::__cxx11::string::~string((string *)&local_148);
  }
  Catch::Section::~Section(&local_a8);
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Catch2_Tests/docs/Catch2DocsSamples.cpp"
  ;
  local_128.line = 0x56;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"American",&local_14d);
  Catch::SectionInfo::SectionInfo((SectionInfo *)local_118,&local_128,&local_148);
  Catch::Section::Section(&local_a8,(SectionInfo *)local_118);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)local_118);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_a8);
  if (bVar1) {
    Greeting::getGreetingFor_abi_cxx11_((string *)&local_148,&object_under_test,American);
    local_c8 = (element_type *)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8 = (_Invoker_type)0x0;
    pRStack_d0 = (Reporter *)0x0;
    auStack_f0._8_8_ = 0;
    auStack_f0._16_8_ = 0;
    aStack_100._8_8_ = (pointer)0x0;
    auStack_f0._0_8_ = (void *)0x0;
    local_118._16_8_ = 0;
    aStack_100._0_8_ = 0;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_b8._0_1_ = false;
    local_b8._1_7_ = 0;
    ApprovalTests::Options::Options((Options *)local_118);
    ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              ((EVP_PKEY_CTX *)&local_148,local_118,siglen_00,in_RCX,in_R8);
    ApprovalTests::Options::~Options((Options *)local_118);
    std::__cxx11::string::~string((string *)&local_148);
  }
  Catch::Section::~Section(&local_a8);
  local_128.file =
       "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Catch2_Tests/docs/Catch2DocsSamples.cpp"
  ;
  local_128.line = 0x5a;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"French",&local_14d);
  Catch::SectionInfo::SectionInfo((SectionInfo *)local_118,&local_128,&local_148);
  Catch::Section::Section(&local_a8,(SectionInfo *)local_118);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)local_118);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_a8);
  if (bVar1) {
    Greeting::getGreetingFor_abi_cxx11_((string *)&local_148,&object_under_test,French);
    local_c8 = (element_type *)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8 = (_Invoker_type)0x0;
    pRStack_d0 = (Reporter *)0x0;
    auStack_f0._8_8_ = 0;
    auStack_f0._16_8_ = 0;
    aStack_100._8_8_ = (pointer)0x0;
    auStack_f0._0_8_ = (void *)0x0;
    local_118._16_8_ = 0;
    aStack_100._0_8_ = 0;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_b8._0_1_ = false;
    local_b8._1_7_ = 0;
    ApprovalTests::Options::Options((Options *)local_118);
    ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              ((EVP_PKEY_CTX *)&local_148,local_118,siglen_01,in_RCX,in_R8);
    ApprovalTests::Options::~Options((Options *)local_118);
    std::__cxx11::string::~string((string *)&local_148);
  }
  Catch::Section::~Section(&local_a8);
  return;
}

Assistant:

explicit Greeting() : nationality(British)
    {
    }